

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

entity * __thiscall grid::removeFromBoard(grid *this,entity *entityToDelete)

{
  int iVar1;
  int iVar2;
  int local_28;
  int i;
  int direction;
  int y;
  int x;
  entity *entityToDelete_local;
  grid *this_local;
  
  direction = entity::getSourceX(entityToDelete);
  i = entity::getSourceY(entityToDelete);
  iVar1 = entity::getDirection(entityToDelete);
  local_28 = 0;
  while( true ) {
    iVar2 = entity::getSize(entityToDelete);
    if (iVar2 <= local_28) break;
    this->board[direction][i] = (entity *)0x0;
    direction = this->directionOperations[iVar1][0] + direction;
    i = this->directionOperations[iVar1][1] + i;
    local_28 = local_28 + 1;
  }
  return entityToDelete;
}

Assistant:

entity *grid::removeFromBoard(entity *entityToDelete) {

    int x= entityToDelete->getSourceX();
    int y = entityToDelete->getSourceY();
    int direction = entityToDelete->getDirection();
    for (int i = 0; i < entityToDelete->getSize(); ++i) {
        board[x][y] = nullptr;
        x += directionOperations[direction][0];
        y += directionOperations[direction][1];
    }

    return entityToDelete;
}